

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifinpdlg(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  runsdef *prVar2;
  ushort *puVar3;
  runsdef *prVar4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  runcxdef *prVar8;
  byte *pbVar9;
  undefined1 *puVar10;
  char *buf;
  int default_index;
  long lVar11;
  int cancel_index;
  long lVar12;
  ulong uVar13;
  uint len;
  uchar *p;
  char *labels [10];
  char lblbuf [256];
  char prompt [256];
  uint local_29c;
  ushort *local_298;
  long local_290;
  char *local_288 [10];
  byte local_238 [256];
  byte local_138 [264];
  
  puVar10 = &stack0xfffffffffffffd58;
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  prVar8 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x01') {
LAB_00214bf3:
    prVar8->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  prVar2 = prVar8->runcxsp;
  lVar11 = (prVar2->runsv).runsvnum;
  prVar8->runcxsp = prVar2 + -1;
  if (prVar2[-1].runstyp != '\x03') {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  local_298 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
  bifcstr(ctx,(char *)local_138,0x100,(uchar *)local_298);
  if (local_138[0] != 0) {
    pbVar9 = local_138;
    do {
      pbVar9 = pbVar9 + 1;
      pbVar9[-1] = G_cmap_output[local_138[0]];
      local_138[0] = *pbVar9;
    } while (local_138[0] != 0);
  }
  prVar2 = ctx->bifcxrun->runcxsp;
  uVar1 = prVar2[-1].runstyp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  prVar8 = ctx->bifcxrun;
  if (uVar1 == '\x01') {
    if (prVar2[-1].runstyp != '\x01') goto LAB_00214bf3;
    iVar6 = *(int *)&prVar8->runcxsp->runsv;
    uVar13 = 0;
  }
  else {
    if (prVar2[-1].runstyp != '\a') {
      prVar8->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3fc);
    }
    puVar3 = (ushort *)(prVar8->runcxsp->runsv).runsvstr;
    local_298 = puVar3 + 1;
    local_29c = (uint)*puVar3;
    if (local_29c == 0) {
      uVar13 = 0;
      iVar6 = 0;
    }
    else {
      lVar12 = 0;
      uVar13 = 0;
      local_290 = lVar11;
      do {
        buf = puVar10 + 0x70;
        if ((char)*local_298 == '\x01') {
          if ((0xfffffffb < *(int *)((long)local_298 + 1) - 5U) &&
             (iVar6 = os_get_str_rsc(*(int *)((long)local_298 + 1),buf,0x100 - lVar12), iVar6 == 0))
          goto LAB_00214b03;
        }
        else if ((char)*local_298 == '\x03') {
          bifcstr(ctx,buf,0x100 - lVar12,(uchar *)((long)local_298 + 1));
          bVar5 = local_238[lVar12];
          if (bVar5 != 0) {
            pbVar9 = puVar10 + 0x71;
            do {
              pbVar9[-1] = G_cmap_output[bVar5];
              bVar5 = *pbVar9;
              pbVar9 = pbVar9 + 1;
            } while (bVar5 != 0);
          }
LAB_00214b03:
          local_288[uVar13] = buf;
          uVar13 = uVar13 + 1;
          sVar7 = strlen(buf);
          lVar12 = lVar12 + sVar7 + 1;
        }
        if ((9 < uVar13) || (0xff < lVar12)) break;
        lstadv((uchar **)&local_298,&local_29c);
        puVar10 = (undefined1 *)((long)local_288 + lVar12 + -0x20);
      } while (local_29c != 0);
      iVar6 = 0;
      lVar11 = local_290;
    }
  }
  prVar4 = ctx->bifcxrun->runcxsp;
  prVar2 = prVar4 + -1;
  cancel_index = 0;
  uVar1 = prVar4[-1].runstyp;
  ctx->bifcxrun->runcxsp = prVar2;
  default_index = 0;
  if (uVar1 != '\x05') {
    prVar8 = ctx->bifcxrun;
    if (prVar2->runstyp != '\x01') goto LAB_00214bf3;
    default_index = *(int *)&prVar8->runcxsp->runsv;
  }
  prVar4 = ctx->bifcxrun->runcxsp;
  prVar2 = prVar4 + -1;
  uVar1 = prVar4[-1].runstyp;
  ctx->bifcxrun->runcxsp = prVar2;
  if (uVar1 != '\x05') {
    prVar8 = ctx->bifcxrun;
    if (prVar2->runstyp != '\x01') goto LAB_00214bf3;
    cancel_index = *(int *)&prVar8->runcxsp->runsv;
  }
  outflushn(0);
  iVar6 = tio_input_dialog((int)lVar11,(char *)local_138,iVar6,local_288,(int)uVar13,default_index,
                           cancel_index);
  runpnum(ctx->bifcxrun,(long)iVar6);
  return;
}

Assistant:

void bifinpdlg(bifcxdef *ctx, int argc)
{
    uchar *p;
    char prompt[256];
    char lblbuf[256];
    char *labels[10];
    char *dst;
    char *xp;
    uint len;
    size_t bcnt;
    int default_resp, cancel_resp;
    int resp;
    int std_btns;
    int icon_id;

    /* check for proper arguments */
    bifcntargs(ctx, 5, argc);

    /* get the icon number */
    icon_id = runpopnum(ctx->bifcxrun);

    /* get the prompt string */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, prompt, (size_t)sizeof(prompt), p);

    /* translate from internal to local characters */
    for (xp = prompt ; *xp != '\0' ; xp++)
        *xp = (char)cmap_i2n(*xp);

    /* check for a standard button set selection */
    if (runtostyp(ctx->bifcxrun) == DAT_NUMBER)
    {
        /* get the standard button set ID */
        std_btns = runpopnum(ctx->bifcxrun);

        /* there are no actual buttons */
        bcnt = 0;
    }
    else
    {
        /* we're not using standard buttons */
        std_btns = 0;
        
        /* get the response string list */
        p = runpoplst(ctx->bifcxrun);
        len = osrp2(p);
        p += 2;
        
        /* build our internal button list */
        for (bcnt = 0, dst = lblbuf ; len != 0 ; lstadv(&p, &len))
        {
            /* see what we have */
            if (*p == DAT_SSTRING)
            {
                /* it's a label string - convert to a C string */
                bifcstr(ctx, dst, sizeof(lblbuf) - (dst - lblbuf), p + 1);

                /* translate from internal to local characters */
                for (xp = dst ; *xp != '\0' ; xp++)
                    *xp = (char)cmap_i2n(*xp);
                
                /* set this button to point to the converted text */
                labels[bcnt++] = dst;
                
                /* move past this label in the button buffer */
                dst += strlen(dst) + 1;
            }
            else if (*p == DAT_NUMBER)
            {
                int id;
                int resid;
                
                /* it's a standard system label ID - get the ID */
                id = (int)osrp4s(p + 1);

                /* translate it to the appropriate string resource */
                switch(id)
                {
                case BIFINPDLG_LBL_OK:
                    resid = RESID_BTN_OK;
                    break;
                    
                case BIFINPDLG_LBL_CANCEL:
                    resid = RESID_BTN_CANCEL;
                    break;
                    
                case BIFINPDLG_LBL_YES:
                    resid = RESID_BTN_YES;
                    break;
                    
                case BIFINPDLG_LBL_NO:
                    resid = RESID_BTN_NO;
                    break;

                default:
                    resid = 0;
                    break;
                }

                /* 
                 *   if we got a valid resource ID, load the resource;
                 *   otherwise, skip this button
                 */
                if (resid != 0
                    && !os_get_str_rsc(resid, dst,
                                       sizeof(lblbuf) - (dst - lblbuf)))
                {
                    /* set this button to point to the converted text */
                    labels[bcnt++] = dst;

                    /* move past this label in the button buffer */
                    dst += strlen(dst) + 1;
                }
            }
            
            /* if we have exhausted our label array, stop now */
            if (bcnt >= sizeof(labels)/sizeof(labels[0])
                || dst >= lblbuf + sizeof(lblbuf))
                break;
        }
    }

    /* get the default response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        default_resp = 0;
    }
    else
        default_resp = runpopnum(ctx->bifcxrun);

    /* get the cancel response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        cancel_resp = 0;
    }
    else
        cancel_resp = runpopnum(ctx->bifcxrun);

    /* flush output before showing the dialog */
    tioflushn(ctx->bifcxtio, 0);

    /* show the dialog */
    resp = tio_input_dialog(icon_id, prompt, std_btns,
                            (const char **)labels, bcnt,
                            default_resp, cancel_resp);

    /* return the result */
    runpnum(ctx->bifcxrun, resp);
}